

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache.h
# Opt level: O1

void __thiscall
CuckooCache::cache<uint256,_SignatureCacheHasher>::insert
          (cache<uint256,_SignatureCacheHasher> *this,uint256 e)

{
  pointer puVar1;
  __atomic_base<unsigned_char> *p_Var2;
  uchar *puVar3;
  uint uVar4;
  pointer puVar5;
  bool bVar6;
  ulong uVar7;
  uint *puVar8;
  ulong uVar9;
  long lVar10;
  _Bit_type *p_Var11;
  byte bVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint local_7c;
  uint local_78 [8];
  ulong local_58;
  ulong uStack_50;
  ulong local_48;
  ulong uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  epoch_check(this);
  local_7c = 0xffffffff;
  uVar7 = (ulong)this->size;
  local_78[0] = (uint)((uint)e.super_base_blob<256U>.m_data._M_elems._0_4_ * uVar7 >> 0x20);
  local_78[1] = (int)((uint)e.super_base_blob<256U>.m_data._M_elems._4_4_ * uVar7 >> 0x20);
  local_78[2] = (int)((uint)e.super_base_blob<256U>.m_data._M_elems._8_4_ * uVar7 >> 0x20);
  local_78[3] = (int)((uint)e.super_base_blob<256U>.m_data._M_elems._12_4_ * uVar7 >> 0x20);
  local_78[4] = (int)((uint)e.super_base_blob<256U>.m_data._M_elems._16_4_ * uVar7 >> 0x20);
  local_78[5] = (int)((uint)e.super_base_blob<256U>.m_data._M_elems._20_4_ * uVar7 >> 0x20);
  local_78[6] = (int)((uint)e.super_base_blob<256U>.m_data._M_elems._24_4_ * uVar7 >> 0x20);
  local_78[7] = (int)((uint)e.super_base_blob<256U>.m_data._M_elems._28_4_ * uVar7 >> 0x20);
  puVar5 = (this->table).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar10 = 0;
  do {
    uVar4 = *(uint *)((long)local_78 + lVar10);
    puVar1 = puVar5 + uVar4;
    auVar14[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0] ==
                  e.super_base_blob<256U>.m_data._M_elems[0]);
    auVar14[1] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 1) ==
                  e.super_base_blob<256U>.m_data._M_elems[1]);
    auVar14[2] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 2) ==
                  e.super_base_blob<256U>.m_data._M_elems[2]);
    auVar14[3] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 3) ==
                  e.super_base_blob<256U>.m_data._M_elems[3]);
    auVar14[4] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 4) ==
                  e.super_base_blob<256U>.m_data._M_elems[4]);
    auVar14[5] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 5) ==
                  e.super_base_blob<256U>.m_data._M_elems[5]);
    auVar14[6] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 6) ==
                  e.super_base_blob<256U>.m_data._M_elems[6]);
    auVar14[7] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 7) ==
                  e.super_base_blob<256U>.m_data._M_elems[7]);
    auVar14[8] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 8) ==
                  e.super_base_blob<256U>.m_data._M_elems[8]);
    auVar14[9] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 9) ==
                  e.super_base_blob<256U>.m_data._M_elems[9]);
    auVar14[10] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 10) ==
                   e.super_base_blob<256U>.m_data._M_elems[10]);
    auVar14[0xb] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xb) ==
                    e.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar14[0xc] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xc) ==
                    e.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar14[0xd] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xd) ==
                    e.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar14[0xe] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xe) ==
                    e.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar14[0xf] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xf) ==
                    e.super_base_blob<256U>.m_data._M_elems[0xf]);
    puVar3 = (uchar *)((long)&puVar5[uVar4].super_base_blob<256U>.m_data + 0x10);
    auVar15[0] = -(*puVar3 == e.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar15[1] = -(puVar3[1] == e.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar15[2] = -(puVar3[2] == e.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar15[3] = -(puVar3[3] == e.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar15[4] = -(puVar3[4] == e.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar15[5] = -(puVar3[5] == e.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar15[6] = -(puVar3[6] == e.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar15[7] = -(puVar3[7] == e.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar15[8] = -(puVar3[8] == e.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar15[9] = -(puVar3[9] == e.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar15[10] = -(puVar3[10] == e.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar15[0xb] = -(puVar3[0xb] == e.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar15[0xc] = -(puVar3[0xc] == e.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar15[0xd] = -(puVar3[0xd] == e.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar15[0xe] = -(puVar3[0xe] == e.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar15[0xf] = -(puVar3[0xf] == e.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar15 = auVar15 & auVar14;
    if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff) {
      LOCK();
      p_Var2 = &(this->collection_flags).mem._M_t.
                super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl[uVar4 >> 3]
                .super___atomic_base<unsigned_char>;
      p_Var2->_M_i = p_Var2->_M_i & ~(byte)(1 << ((byte)uVar4 & 7));
      UNLOCK();
      p_Var11 = (this->epoch_flags).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar13 = 1L << ((byte)uVar4 & 0x3f);
      uVar7 = (ulong)(uVar4 >> 6);
LAB_0041afd6:
      p_Var11[uVar7] = p_Var11[uVar7] | uVar13;
      goto LAB_0041afda;
    }
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x20);
  if (this->depth_limit != '\0') {
    bVar12 = 0;
    bVar6 = true;
    do {
      lVar10 = 0;
      do {
        uVar4 = *(uint *)((long)local_78 + lVar10);
        if (((this->collection_flags).mem._M_t.
             super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
             .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl[uVar4 >> 3].
             super___atomic_base<unsigned_char>._M_i >> (uVar4 & 7) & 1) != 0) {
          puVar5 = (this->table).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar3 = (uchar *)((long)&puVar5[uVar4].super_base_blob<256U>.m_data + 0x10);
          *(ulong *)puVar3 =
               CONCAT44(e.super_base_blob<256U>.m_data._M_elems._20_4_,
                        e.super_base_blob<256U>.m_data._M_elems._16_4_);
          *(ulong *)(puVar3 + 8) =
               CONCAT44(e.super_base_blob<256U>.m_data._M_elems._28_4_,
                        e.super_base_blob<256U>.m_data._M_elems._24_4_);
          puVar5 = puVar5 + uVar4;
          *(ulong *)&(puVar5->super_base_blob<256U>).m_data =
               CONCAT44(e.super_base_blob<256U>.m_data._M_elems._4_4_,
                        e.super_base_blob<256U>.m_data._M_elems._0_4_);
          *(ulong *)((long)&(puVar5->super_base_blob<256U>).m_data + 8) =
               CONCAT44(e.super_base_blob<256U>.m_data._M_elems._12_4_,
                        e.super_base_blob<256U>.m_data._M_elems._8_4_);
          LOCK();
          p_Var2 = &(this->collection_flags).mem._M_t.
                    super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                    .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl
                    [uVar4 >> 3].super___atomic_base<unsigned_char>;
          p_Var2->_M_i = p_Var2->_M_i & ~(byte)(1 << ((byte)uVar4 & 7));
          UNLOCK();
          p_Var11 = (this->epoch_flags).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          uVar7 = (ulong)(uVar4 >> 6);
          uVar13 = 1L << ((byte)uVar4 & 0x3f);
          if (bVar6) goto LAB_0041afd6;
          p_Var11[uVar7] = p_Var11[uVar7] & ~uVar13;
          goto LAB_0041afda;
        }
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0x20);
      puVar8 = std::__find_if<unsigned_int*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                         (local_78,&local_58,&local_7c);
      local_7c = local_78[((uint)((int)puVar8 - (int)local_78) >> 2) + 1 & 7];
      uVar9 = (ulong)local_7c;
      puVar5 = (this->table).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_58 = *(ulong *)&puVar5[uVar9].super_base_blob<256U>.m_data;
      uStack_50 = *(ulong *)((long)&puVar5[uVar9].super_base_blob<256U>.m_data + 8);
      puVar3 = (uchar *)((long)&puVar5[uVar9].super_base_blob<256U>.m_data + 0x10);
      local_48 = *(ulong *)puVar3;
      uStack_40 = *(ulong *)(puVar3 + 8);
      puVar3 = (uchar *)((long)&puVar5[uVar9].super_base_blob<256U>.m_data + 0x10);
      *(ulong *)puVar3 =
           CONCAT44(e.super_base_blob<256U>.m_data._M_elems._20_4_,
                    e.super_base_blob<256U>.m_data._M_elems._16_4_);
      *(ulong *)(puVar3 + 8) =
           CONCAT44(e.super_base_blob<256U>.m_data._M_elems._28_4_,
                    e.super_base_blob<256U>.m_data._M_elems._24_4_);
      *(ulong *)&puVar5[uVar9].super_base_blob<256U>.m_data =
           CONCAT44(e.super_base_blob<256U>.m_data._M_elems._4_4_,
                    e.super_base_blob<256U>.m_data._M_elems._0_4_);
      *(ulong *)((long)&puVar5[uVar9].super_base_blob<256U>.m_data + 8) =
           CONCAT44(e.super_base_blob<256U>.m_data._M_elems._12_4_,
                    e.super_base_blob<256U>.m_data._M_elems._8_4_);
      e.super_base_blob<256U>.m_data._M_elems._16_4_ = SUB84(local_48,0);
      e.super_base_blob<256U>.m_data._M_elems._20_4_ = SUB84(local_48 >> 0x20,0);
      e.super_base_blob<256U>.m_data._M_elems._24_4_ = SUB84(uStack_40,0);
      e.super_base_blob<256U>.m_data._M_elems._28_4_ = SUB84(uStack_40 >> 0x20,0);
      e.super_base_blob<256U>.m_data._M_elems._0_4_ = SUB84(local_58,0);
      e.super_base_blob<256U>.m_data._M_elems._4_4_ = SUB84(local_58 >> 0x20,0);
      e.super_base_blob<256U>.m_data._M_elems._8_4_ = SUB84(uStack_50,0);
      e.super_base_blob<256U>.m_data._M_elems._12_4_ = SUB84(uStack_50 >> 0x20,0);
      p_Var11 = (this->epoch_flags).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar7 = p_Var11[local_7c >> 6];
      uVar13 = uVar7 | 1L << (uVar9 & 0x3f);
      if (!bVar6) {
        uVar13 = uVar7 & ~(1L << (uVar9 & 0x3f));
      }
      p_Var11[local_7c >> 6] = uVar13;
      uVar13 = (ulong)this->size;
      local_78[0] = (uint)((local_58 & 0xffffffff) * uVar13 >> 0x20);
      local_78[1] = (int)((uint)e.super_base_blob<256U>.m_data._M_elems._4_4_ * uVar13 >> 0x20);
      local_78[2] = (int)((uStack_50 & 0xffffffff) * uVar13 >> 0x20);
      local_78[3] = (int)((uint)e.super_base_blob<256U>.m_data._M_elems._12_4_ * uVar13 >> 0x20);
      local_78[4] = (int)((local_48 & 0xffffffff) * uVar13 >> 0x20);
      local_78[5] = (int)((uint)e.super_base_blob<256U>.m_data._M_elems._20_4_ * uVar13 >> 0x20);
      local_78[6] = (int)((uStack_40 & 0xffffffff) * uVar13 >> 0x20);
      local_78[7] = (int)((uint)e.super_base_blob<256U>.m_data._M_elems._28_4_ * uVar13 >> 0x20);
      bVar12 = bVar12 + 1;
      bVar6 = (uVar7 >> (uVar9 & 0x3f) & 1) != 0;
    } while (bVar12 < this->depth_limit);
  }
LAB_0041afda:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void insert(Element e)
    {
        epoch_check();
        uint32_t last_loc = invalid();
        bool last_epoch = true;
        std::array<uint32_t, 8> locs = compute_hashes(e);
        // Make sure we have not already inserted this element
        // If we have, make sure that it does not get deleted
        for (const uint32_t loc : locs)
            if (table[loc] == e) {
                please_keep(loc);
                epoch_flags[loc] = last_epoch;
                return;
            }
        for (uint8_t depth = 0; depth < depth_limit; ++depth) {
            // First try to insert to an empty slot, if one exists
            for (const uint32_t loc : locs) {
                if (!collection_flags.bit_is_set(loc))
                    continue;
                table[loc] = std::move(e);
                please_keep(loc);
                epoch_flags[loc] = last_epoch;
                return;
            }
            /** Swap with the element at the location that was
            * not the last one looked at. Example:
            *
            * 1. On first iteration, last_loc == invalid(), find returns last, so
            *    last_loc defaults to locs[0].
            * 2. On further iterations, where last_loc == locs[k], last_loc will
            *    go to locs[k+1 % 8], i.e., next of the 8 indices wrapping around
            *    to 0 if needed.
            *
            * This prevents moving the element we just put in.
            *
            * The swap is not a move -- we must switch onto the evicted element
            * for the next iteration.
            */
            last_loc = locs[(1 + (std::find(locs.begin(), locs.end(), last_loc) - locs.begin())) & 7];
            std::swap(table[last_loc], e);
            // Can't std::swap a std::vector<bool>::reference and a bool&.
            bool epoch = last_epoch;
            last_epoch = epoch_flags[last_loc];
            epoch_flags[last_loc] = epoch;

            // Recompute the locs -- unfortunately happens one too many times!
            locs = compute_hashes(e);
        }
    }